

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasquadtree.cpp
# Opt level: O0

U32 __thiscall
LASquadtree::get_level_index(LASquadtree *this,F64 x,F64 y,U32 level,F32 *min,F32 *max)

{
  float fVar1;
  float fVar2;
  float fVar3;
  uint local_54;
  float local_50;
  U32 level_index;
  float cell_max_y;
  float cell_min_y;
  float cell_max_x;
  float cell_min_x;
  float cell_mid_y;
  float cell_mid_x;
  F32 *max_local;
  F32 *min_local;
  U32 level_local;
  F64 y_local;
  F64 x_local;
  LASquadtree *this_local;
  
  cell_min_y = (float)this->min_x;
  cell_max_y = (float)this->max_x;
  level_index = (U32)this->min_y;
  local_50 = (float)this->max_y;
  local_54 = 0;
  for (min_local._4_4_ = level; min_local._4_4_ != 0; min_local._4_4_ = min_local._4_4_ - 1) {
    local_54 = local_54 << 2;
    fVar2 = (cell_min_y + cell_max_y) / 2.0;
    fVar3 = ((float)level_index + local_50) / 2.0;
    fVar1 = fVar2;
    if ((double)fVar2 <= (double)x) {
      local_54 = local_54 | 1;
      fVar1 = cell_max_y;
      cell_min_y = fVar2;
    }
    cell_max_y = fVar1;
    fVar1 = fVar3;
    if ((double)fVar3 <= (double)y) {
      local_54 = local_54 | 2;
      fVar1 = local_50;
      level_index = (U32)fVar3;
    }
    local_50 = fVar1;
  }
  if (min != (F32 *)0x0) {
    *min = (F32)cell_min_y;
    min[1] = (F32)level_index;
  }
  if (max != (F32 *)0x0) {
    *max = (F32)cell_max_y;
    max[1] = (F32)local_50;
  }
  return local_54;
}

Assistant:

U32 LASquadtree::get_level_index(const F64 x, const F64 y, U32 level, F32* min, F32* max) const
{
  volatile float cell_mid_x;
  volatile float cell_mid_y;
  float cell_min_x, cell_max_x;
  float cell_min_y, cell_max_y;
  
  cell_min_x = min_x;
  cell_max_x = max_x;
  cell_min_y = min_y;
  cell_max_y = max_y;

  U32 level_index = 0;

  while (level)
  {
    level_index <<= 2;

    cell_mid_x = (cell_min_x + cell_max_x)/2;
    cell_mid_y = (cell_min_y + cell_max_y)/2;

    if (x < cell_mid_x)
    {
      cell_max_x = cell_mid_x;
    }
    else
    {
      cell_min_x = cell_mid_x;
      level_index |= 1;
    }
    if (y < cell_mid_y)
    {
      cell_max_y = cell_mid_y;
    }
    else
    {
      cell_min_y = cell_mid_y;
      level_index |= 2;
    }
    level--;
  }
  if (min)
  {
    min[0] = cell_min_x;
    min[1] = cell_min_y;
  }
  if (max)
  {
    max[0] = cell_max_x;
    max[1] = cell_max_y;
  }
  return level_index;
}